

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

Vec_Int_t *
Gia_Gen2CreateMuxes(Gia_Man_t *pNew,int nLutSize,int nLutNum,Vec_Int_t *vPLits,Vec_Int_t *vXLits)

{
  int Entry;
  Vec_Int_t *p;
  int *piVar1;
  int iVar2;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < nLutNum - 1U) {
    iVar2 = nLutNum;
  }
  p->nSize = 0;
  p->nCap = iVar2;
  if (iVar2 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar2 << 2);
  }
  p->pArray = piVar1;
  if (vPLits->nSize == nLutNum << ((byte)nLutSize & 0x1f)) {
    if (vXLits->nSize == nLutSize) {
      if (0 < nLutNum) {
        iVar2 = 0;
        do {
          Entry = Gia_Gen2CreateMux_rec
                            (pNew,vXLits->pArray,nLutSize,vPLits,iVar2 << ((byte)nLutSize & 0x1f));
          Vec_IntPush(p,Entry);
          iVar2 = iVar2 + 1;
        } while (nLutNum != iVar2);
      }
      return p;
    }
    __assert_fail("Vec_IntSize(vXLits) == nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0xd7,
                  "Vec_Int_t *Gia_Gen2CreateMuxes(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  __assert_fail("Vec_IntSize(vPLits) == nLutNum * (1 << nLutSize)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                ,0xd6,
                "Vec_Int_t *Gia_Gen2CreateMuxes(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_Gen2CreateMuxes( Gia_Man_t * pNew, int nLutSize, int nLutNum, Vec_Int_t * vPLits, Vec_Int_t * vXLits )
{
    Vec_Int_t * vLits = Vec_IntAlloc( nLutNum );
    int i, iMux;
    // add MUXes for each group of flops
    assert( Vec_IntSize(vPLits) == nLutNum * (1 << nLutSize) );
    assert( Vec_IntSize(vXLits) == nLutSize );
    for ( i = 0; i < nLutNum; i++ )
    {
        iMux = Gia_Gen2CreateMux_rec( pNew, Vec_IntArray(vXLits), nLutSize, vPLits, i * (1 << nLutSize) );
        Vec_IntPush( vLits, iMux );
    }
    return vLits;
}